

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::Texture3DFilteringCase::init
          (Texture3DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  *this_00;
  uint height;
  uint depth;
  pointer pPVar1;
  uint uVar2;
  int i;
  int extraout_EAX;
  long lVar3;
  Texture3D *pTVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  Vec4 gMax;
  Vector<float,_4> res_3;
  Vec4 cScale;
  Vec4 gMin;
  Vector<float,_4> res_7;
  Vec4 cBias;
  Vector<float,_4> res_6;
  TextureFormat texFmt;
  TextureFormatInfo fmtInfo;
  uint local_11c;
  Vec4 local_118;
  uint local_100;
  uint local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8 [4];
  FilterCase local_d8;
  Vec4 local_b8;
  float local_a8 [4];
  float local_98 [4];
  TextureFormat local_88;
  RGBA local_80 [4];
  TextureFormatInfo local_70;
  
  local_88 = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&local_70,&local_88);
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  local_e8[3] = 0.0;
  lVar3 = 0;
  do {
    local_e8[lVar3] = local_70.valueMax.m_data[lVar3] - local_70.valueMin.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_a8[0] = local_70.valueMin.m_data[0];
  local_a8[1] = local_70.valueMin.m_data[1];
  local_a8[2] = local_70.valueMin.m_data[2];
  local_a8[3] = local_70.valueMin.m_data[3];
  uVar7 = this->m_width;
  height = this->m_height;
  uVar2 = height;
  if ((int)height < (int)uVar7) {
    uVar2 = uVar7;
  }
  depth = this->m_depth;
  if ((int)uVar2 <= (int)depth) {
    uVar2 = depth;
  }
  local_11c = 0x20;
  if (uVar2 != 0) {
    local_11c = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> local_11c == 0; local_11c = local_11c - 1) {
      }
    }
    local_11c = local_11c ^ 0x1f;
  }
  pTVar4 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,uVar7,
             height,depth);
  this->m_gradientTex = pTVar4;
  pTVar4 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,
             this->m_width,this->m_height,this->m_depth);
  this->m_gridTex = pTVar4;
  if (uVar2 != 0) {
    iVar6 = 0x1f - local_11c;
    uVar8 = 0;
    iVar5 = 0;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
    do {
      local_f8 = 0;
      uStack_f0 = 0x3f80000000000000;
      local_118.m_data[0] = 0.0;
      local_118.m_data[1] = 0.0;
      local_118.m_data[2] = 0.0;
      local_118.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        local_118.m_data[lVar3] = *(float *)((long)&local_f8 + lVar3 * 4) * local_e8[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_d8.texture = (Texture3D *)0x0;
      local_d8.lod.m_data[0] = 0.0;
      local_d8.lod.m_data[1] = 0.0;
      lVar3 = 0;
      do {
        local_d8.lod.m_data[lVar3 + -2] = local_118.m_data[lVar3] + local_a8[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_b8.m_data._0_8_ = &DAT_3f8000003f800000;
      local_b8.m_data[2] = 1.0;
      local_b8.m_data[3] = 0.0;
      local_f8 = 0;
      uStack_f0 = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_f8 + lVar3 * 4) = local_b8.m_data[lVar3] * local_e8[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_118.m_data[0] = 0.0;
      local_118.m_data[1] = 0.0;
      local_118.m_data[2] = 0.0;
      local_118.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        local_118.m_data[lVar3] = *(float *)((long)&local_f8 + lVar3 * 4) + local_a8[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      tcu::Texture3D::allocLevel(&this->m_gradientTex->m_refTexture,(int)uVar8);
      tcu::fillWithComponentGradients
                ((this->m_gradientTex->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,(Vec4 *)&local_d8,&local_118);
      uVar8 = uVar8 + 1;
    } while (uVar8 != iVar5 + 1);
    uVar8 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    do {
      tcu::Texture3D::allocLevel(&this->m_gridTex->m_refTexture,(int)uVar8);
      uVar7 = (int)uVar8 * (int)(0xffffff / (ulong)(0x20 - local_11c));
      local_fc = uVar7 | 0xff000000;
      pPVar1 = (this->m_gridTex->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tcu::RGBA::toVec((RGBA *)&local_f8);
      local_100 = ~uVar7 | 0xff000000;
      local_118.m_data[0] = 0.0;
      local_118.m_data[1] = 0.0;
      local_118.m_data[2] = 0.0;
      local_118.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        local_118.m_data[lVar3] = *(float *)((long)&local_f8 + lVar3 * 4) * local_e8[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_d8.texture = (Texture3D *)0x0;
      local_d8.lod.m_data[0] = 0.0;
      local_d8.lod.m_data[1] = 0.0;
      lVar3 = 0;
      do {
        local_d8.lod.m_data[lVar3 + -2] = local_118.m_data[lVar3] + local_a8[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      tcu::RGBA::toVec(local_80);
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      local_98[3] = 0.0;
      lVar3 = 0;
      do {
        local_98[lVar3] = (float)local_80[lVar3].m_value * local_e8[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_b8.m_data._0_8_ = (undefined1 *)0x0;
      local_b8.m_data[2] = 0.0;
      local_b8.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        local_b8.m_data[lVar3] = local_98[lVar3] + local_a8[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      tcu::fillWithGrid(pPVar1 + uVar8,4,(Vec4 *)&local_d8,&local_b8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != iVar6 + 1);
  }
  glu::Texture3D::upload(this->m_gradientTex);
  glu::Texture3D::upload(this->m_gridTex);
  local_d8.texture = this->m_gradientTex;
  local_d8.lod.m_data[0] = 1.5;
  local_d8.lod.m_data[1] = 2.8;
  local_d8.lod.m_data[2] = 1.0;
  local_d8.offset.m_data[0] = -1.0;
  local_d8.offset.m_data[1] = -2.7;
  local_d8.offset.m_data[2] = -2.275;
  this_00 = &this->m_cases;
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>(this_00,&local_d8);
  local_d8.texture = this->m_gradientTex;
  local_d8.lod.m_data[0] = -2.0;
  local_d8.lod.m_data[1] = -1.5;
  local_d8.lod.m_data[2] = -1.8;
  local_d8.offset.m_data[0] = -0.1;
  local_d8.offset.m_data[1] = 0.9;
  local_d8.offset.m_data[2] = -0.25;
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>(this_00,&local_d8);
  local_d8.texture = this->m_gridTex;
  local_d8.lod.m_data[0] = 0.2;
  local_d8.lod.m_data[1] = 0.175;
  local_d8.lod.m_data[2] = 0.3;
  local_d8.offset.m_data[0] = -2.0;
  local_d8.offset.m_data[1] = -3.7;
  local_d8.offset.m_data[2] = -1.825;
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>(this_00,&local_d8);
  local_d8.texture = this->m_gridTex;
  local_d8.lod.m_data[0] = -0.8;
  local_d8.lod.m_data[1] = -2.3;
  local_d8.lod.m_data[2] = -2.5;
  local_d8.offset.m_data[0] = 0.2;
  local_d8.offset.m_data[1] = -0.1;
  local_d8.offset.m_data[2] = 1.325;
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>(this_00,&local_d8);
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture3DFilteringCase::init (void)
{
	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(de::max(de::max(m_width, m_height), m_depth)) + 1;

		// Create textures.
		m_gradientTex	= new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);
		m_gridTex		= new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);

		// Fill first gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			tcu::Vec4 gMin = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			tcu::Vec4 gMax = tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f)*cScale + cBias;

			m_gradientTex->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_gradientTex->getRefTexture().getLevel(levelNdx), gMin, gMax);
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step	= 0x00ffffff / numLevels;
			deUint32	rgb		= step*levelNdx;
			deUint32	colorA	= 0xff000000 | rgb;
			deUint32	colorB	= 0xff000000 | ~rgb;

			m_gridTex->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_gridTex->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec3(1.5f, 2.8f, 1.0f),	tcu::Vec3(-1.0f, -2.7f, -2.275f)));
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec3(-2.0f, -1.5f, -1.8f),	tcu::Vec3(-0.1f, 0.9f, -0.25f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec3(0.2f, 0.175f, 0.3f),	tcu::Vec3(-2.0f, -3.7f, -1.825f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec3(-0.8f, -2.3f, -2.5f),	tcu::Vec3(0.2f, -0.1f, 1.325f)));

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture3DFilteringCase::deinit();
		throw;
	}
}